

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void iadst16_low8_ssse3(__m128i *input,__m128i *output)

{
  longlong lVar1;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  __m128i *cospi;
  int8_t in_R8B;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  __m128i __rounding;
  __m128i __rounding_00;
  __m128i __rounding_01;
  __m128i local_118;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  auVar13 = pshuflw(ZEXT416((uint)0xc9),ZEXT416((uint)0xc9),0);
  auVar14._0_4_ = auVar13._0_4_;
  auVar14._4_4_ = auVar14._0_4_;
  auVar14._8_4_ = auVar14._0_4_;
  auVar14._12_4_ = auVar14._0_4_;
  auVar13 = psllw(auVar14,3);
  auVar16 = pshuflw(ZEXT416(0xffff8028),ZEXT416(0xffff8028),0);
  auVar17._0_4_ = auVar16._0_4_;
  auVar17._4_4_ = auVar17._0_4_;
  auVar17._8_4_ = auVar17._0_4_;
  auVar17._12_4_ = auVar17._0_4_;
  local_118 = (__m128i)pmulhrsw(auVar13,(undefined1  [16])*input);
  local_108 = pmulhrsw(auVar17,(undefined1  [16])*input);
  auVar13 = pshuflw(ZEXT416((uint)0x3e3),ZEXT416((uint)0x3e3),0);
  auVar11._0_4_ = auVar13._0_4_;
  auVar11._4_4_ = auVar11._0_4_;
  auVar11._8_4_ = auVar11._0_4_;
  auVar11._12_4_ = auVar11._0_4_;
  auVar13 = psllw(auVar11,3);
  auVar16 = pshuflw(ZEXT416(0xffff83d8),ZEXT416(0xffff83d8),0);
  auVar15._0_4_ = auVar16._0_4_;
  auVar15._4_4_ = auVar15._0_4_;
  auVar15._8_4_ = auVar15._0_4_;
  auVar15._12_4_ = auVar15._0_4_;
  local_f8 = pmulhrsw(auVar13,(undefined1  [16])input[2]);
  local_e8 = pmulhrsw(auVar15,(undefined1  [16])input[2]);
  auVar13 = pshuflw(ZEXT416((uint)0x6d7),ZEXT416((uint)0x6d7),0);
  auVar9._0_4_ = auVar13._0_4_;
  auVar9._4_4_ = auVar9._0_4_;
  auVar9._8_4_ = auVar9._0_4_;
  auVar9._12_4_ = auVar9._0_4_;
  auVar13 = psllw(auVar9,3);
  auVar16 = pshuflw(ZEXT416(0xffff8c48),ZEXT416(0xffff8c48),0);
  auVar12._0_4_ = auVar16._0_4_;
  auVar12._4_4_ = auVar12._0_4_;
  auVar12._8_4_ = auVar12._0_4_;
  auVar12._12_4_ = auVar12._0_4_;
  local_d8 = pmulhrsw(auVar13,(undefined1  [16])input[4]);
  local_c8 = pmulhrsw(auVar12,(undefined1  [16])input[4]);
  auVar13 = pshuflw(ZEXT416((uint)0x988),ZEXT416((uint)0x988),0);
  auVar7._0_4_ = auVar13._0_4_;
  auVar7._4_4_ = auVar7._0_4_;
  auVar7._8_4_ = auVar7._0_4_;
  auVar7._12_4_ = auVar7._0_4_;
  auVar13 = psllw(auVar7,3);
  lVar1 = 0xffff9930;
  auVar16 = pshuflw(ZEXT416(0xffff9930),ZEXT416(0xffff9930),0);
  auVar10._0_4_ = auVar16._0_4_;
  auVar10._4_4_ = auVar10._0_4_;
  auVar10._8_4_ = auVar10._0_4_;
  auVar10._12_4_ = auVar10._0_4_;
  local_b8 = pmulhrsw(auVar13,(undefined1  [16])input[6]);
  local_a8 = pmulhrsw(auVar10,(undefined1  [16])input[6]);
  auVar13 = pshuflw(ZEXT416((uint)0xabf),ZEXT416((uint)0xabf),0);
  auVar5._0_4_ = auVar13._0_4_;
  auVar5._4_4_ = auVar5._0_4_;
  auVar5._8_4_ = auVar5._0_4_;
  auVar5._12_4_ = auVar5._0_4_;
  auVar13 = psllw(auVar5,3);
  auVar16 = pshuflw(ZEXT416((uint)0xbdb),ZEXT416((uint)0xbdb),0);
  auVar8._0_4_ = auVar16._0_4_;
  auVar8._4_4_ = auVar8._0_4_;
  auVar8._8_4_ = auVar8._0_4_;
  auVar8._12_4_ = auVar8._0_4_;
  auVar16 = psllw(auVar8,3);
  local_98 = pmulhrsw(auVar13,(undefined1  [16])input[7]);
  local_88 = pmulhrsw(auVar16,(undefined1  [16])input[7]);
  auVar13 = pshuflw(ZEXT416((uint)0x83a),ZEXT416((uint)0x83a),0);
  auVar3._0_4_ = auVar13._0_4_;
  auVar3._4_4_ = auVar3._0_4_;
  auVar3._8_4_ = auVar3._0_4_;
  auVar3._12_4_ = auVar3._0_4_;
  auVar13 = psllw(auVar3,3);
  auVar16 = pshuflw(ZEXT416((uint)0xdb9),ZEXT416((uint)0xdb9),0);
  auVar6._0_4_ = auVar16._0_4_;
  auVar6._4_4_ = auVar6._0_4_;
  auVar6._8_4_ = auVar6._0_4_;
  auVar6._12_4_ = auVar6._0_4_;
  auVar16 = psllw(auVar6,3);
  local_78 = pmulhrsw(auVar13,(undefined1  [16])input[5]);
  local_68 = pmulhrsw(auVar16,(undefined1  [16])input[5]);
  auVar13 = pshuflw(ZEXT416((uint)0x564),ZEXT416((uint)0x564),0);
  auVar16._0_4_ = auVar13._0_4_;
  auVar16._4_4_ = auVar16._0_4_;
  auVar16._8_4_ = auVar16._0_4_;
  auVar16._12_4_ = auVar16._0_4_;
  auVar13 = psllw(auVar16,3);
  auVar16 = pshuflw(ZEXT416((uint)0xf11),ZEXT416((uint)0xf11),0);
  auVar4._0_4_ = auVar16._0_4_;
  auVar4._4_4_ = auVar4._0_4_;
  auVar4._8_4_ = auVar4._0_4_;
  auVar4._12_4_ = auVar4._0_4_;
  auVar16 = psllw(auVar4,3);
  local_58 = pmulhrsw(auVar13,(undefined1  [16])input[3]);
  local_48 = pmulhrsw(auVar16,(undefined1  [16])input[3]);
  auVar13 = pshuflw(ZEXT416((uint)0x259),ZEXT416((uint)0x259),0);
  auVar13._4_4_ = auVar13._0_4_;
  auVar13._8_4_ = auVar13._0_4_;
  auVar13._12_4_ = auVar13._0_4_;
  auVar13 = psllw(auVar13,3);
  auVar16 = pshuflw(ZEXT416((uint)0xfd4),ZEXT416((uint)0xfd4),0);
  auVar2._0_4_ = auVar16._0_4_;
  auVar2._4_4_ = auVar2._0_4_;
  auVar2._8_4_ = auVar2._0_4_;
  auVar2._12_4_ = auVar2._0_4_;
  auVar16 = psllw(auVar2,3);
  local_38 = pmulhrsw(auVar13,(undefined1  [16])input[1]);
  local_28 = pmulhrsw(auVar16,(undefined1  [16])input[1]);
  cospi = output;
  iadst16_stage3_ssse3(&local_118);
  __rounding[1] = lVar1;
  __rounding[0] = extraout_RDX;
  iadst16_stage4_ssse3(&local_118,(int32_t *)cospi,__rounding,in_R8B);
  iadst16_stage5_ssse3(&local_118);
  __rounding_00[1] = lVar1;
  __rounding_00[0] = extraout_RDX_00;
  iadst16_stage6_ssse3(&local_118,(int32_t *)cospi,__rounding_00,in_R8B);
  iadst16_stage7_ssse3(&local_118);
  __rounding_01[1] = lVar1;
  __rounding_01[0] = extraout_RDX_01;
  iadst16_stage8_ssse3(&local_118,(int32_t *)cospi,__rounding_01,in_R8B);
  iadst16_stage9_ssse3(output,&local_118);
  return;
}

Assistant:

static void iadst16_low8_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  // stage 1
  __m128i x[16];
  x[1] = input[0];
  x[3] = input[2];
  x[5] = input[4];
  x[7] = input[6];
  x[8] = input[7];
  x[10] = input[5];
  x[12] = input[3];
  x[14] = input[1];

  // stage 2
  btf_16_ssse3(cospi[62], -cospi[2], x[1], x[0], x[1]);
  btf_16_ssse3(cospi[54], -cospi[10], x[3], x[2], x[3]);
  btf_16_ssse3(cospi[46], -cospi[18], x[5], x[4], x[5]);
  btf_16_ssse3(cospi[38], -cospi[26], x[7], x[6], x[7]);
  btf_16_ssse3(cospi[34], cospi[30], x[8], x[8], x[9]);
  btf_16_ssse3(cospi[42], cospi[22], x[10], x[10], x[11]);
  btf_16_ssse3(cospi[50], cospi[14], x[12], x[12], x[13]);
  btf_16_ssse3(cospi[58], cospi[6], x[14], x[14], x[15]);

  // stage 3
  iadst16_stage3_ssse3(x);
  iadst16_stage4_ssse3(x, cospi, __rounding, cos_bit);
  iadst16_stage5_ssse3(x);
  iadst16_stage6_ssse3(x, cospi, __rounding, cos_bit);
  iadst16_stage7_ssse3(x);
  iadst16_stage8_ssse3(x, cospi, __rounding, cos_bit);
  iadst16_stage9_ssse3(output, x);
}